

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O1

void __thiscall
CMU462::DynamicScene::XFormWidget::drag
          (XFormWidget *this,double x,double y,double dx,double dy,Matrix4x4 *modelViewProj)

{
  double dVar1;
  double dVar2;
  Axis AVar3;
  Mode MVar4;
  HalfedgeElement *pHVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  _func_int **pp_Var9;
  SceneObject *p;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  double dVar14;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  vector<int,_std::allocator<int>_> I;
  int view [4];
  double winZ;
  double winY;
  double winX;
  double proj [16];
  vector<int,_std::allocator<int>_> local_238;
  vector<int,_std::allocator<int>_> local_220;
  Matrix4x4 local_208;
  vector<int,_std::allocator<int>_> local_188;
  vector<int,_std::allocator<int>_> local_170;
  Vector3D local_158;
  Vector3D local_140;
  double local_128;
  int iStack_11c;
  double local_118;
  double dStack_110;
  undefined1 local_100 [8];
  double local_f8;
  double local_f0;
  Vector3D local_e8;
  Vector3D local_d0;
  Vector4D local_b8 [4];
  
  AVar3 = (this->target).axis;
  p = (this->target).object;
  if (p == (SceneObject *)0x0 || AVar3 == None) {
    return;
  }
  pHVar5 = (this->target).element;
  if ((pHVar5 == (HalfedgeElement *)0x0) && (this->objectMode != true)) {
    return;
  }
  MVar4 = this->mode;
  if (this->objectMode != true) {
    if (AVar3 == Center && MVar4 == Translate) {
      (*pHVar5->_vptr_HalfedgeElement[4])(SUB84(dx,0),SUB84(dy,0),pHVar5,modelViewProj);
      return;
    }
    lVar6 = __dynamic_cast(pHVar5,&HalfedgeElement::typeinfo,&Vertex::typeinfo,0);
    lVar7 = __dynamic_cast(pHVar5,&HalfedgeElement::typeinfo,&Edge::typeinfo,0);
    lVar8 = __dynamic_cast(pHVar5,&HalfedgeElement::typeinfo,&Face::typeinfo,0);
    (**pHVar5->_vptr_HalfedgeElement)(&local_208,pHVar5);
    (this->center).z = local_208.entries[0].z;
    (this->center).x = local_208.entries[0].x;
    (this->center).y = local_208.entries[0].y;
    local_b8[0].x = 0.0;
    local_b8[0].y = (double)((ulong)local_b8[0].y._4_4_ << 0x20);
    __l._M_len = 3;
    __l._M_array = (iterator)local_b8;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&local_208,__l,(allocator_type *)&local_128);
    pp_Var9 = (_func_int **)local_208.entries[0].x;
    switch((this->target).axis) {
    case X:
      break;
    case Y:
      pp_Var9 = (_func_int **)((long)local_208.entries[0].x + 4);
      break;
    case Z:
      pp_Var9 = (_func_int **)((long)local_208.entries[0].x + 8);
      break;
    case Center:
      *(undefined8 *)((long)local_208.entries[0].x + 4) = 0x100000001;
      break;
    default:
      goto switchD_00175b72_default;
    }
    *(undefined4 *)pp_Var9 = 1;
switchD_00175b72_default:
    if (lVar6 == 0) {
      if (lVar7 == 0) {
        if (lVar8 != 0) {
          lVar6 = *(long *)(lVar8 + 0xa8);
          do {
            lVar7 = *(long *)(lVar6 + 0x28);
            std::vector<int,_std::allocator<int>_>::vector
                      (&local_188,(vector<int,_std::allocator<int>_> *)&local_208);
            local_158.x = (this->center).x;
            local_158.y = (this->center).y;
            local_158.z = (this->center).z;
            directionalTransform
                      (this,(Vector3D *)(lVar7 + 0x18),&local_188,&local_158,x,y,dx,dy,modelViewProj
                      );
            if (local_188.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_188.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)local_188.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage -
                              (long)local_188.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start);
            }
            lVar6 = *(long *)(lVar6 + 0x20);
          } while (*(long *)(lVar8 + 0xa8) != lVar6);
        }
      }
      else {
        lVar6 = *(long *)(lVar7 + 0x58);
        do {
          lVar8 = *(long *)(lVar6 + 0x28);
          std::vector<int,_std::allocator<int>_>::vector
                    (&local_170,(vector<int,_std::allocator<int>_> *)&local_208);
          local_140.x = (this->center).x;
          local_140.y = (this->center).y;
          local_140.z = (this->center).z;
          directionalTransform
                    (this,(Vector3D *)(lVar8 + 0x18),&local_170,&local_140,x,y,dx,dy,modelViewProj);
          if (local_170.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_170.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_170.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_170.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          lVar6 = *(long *)(lVar6 + 0x18);
        } while (*(long *)(lVar7 + 0x58) != lVar6);
      }
    }
    else {
      std::vector<int,_std::allocator<int>_>::vector
                (&local_238,(vector<int,_std::allocator<int>_> *)&local_208);
      local_e8.x = (this->center).x;
      local_e8.y = (this->center).y;
      local_e8.z = (this->center).z;
      directionalTransform
                (this,(Vector3D *)(lVar6 + 8),&local_238,&local_e8,x,y,dx,dy,modelViewProj);
      if (local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
    }
    (this->clickPosition).x = x;
    (this->clickPosition).y = y;
    goto LAB_00176179;
  }
  if (MVar4 == Scale) {
    p = (SceneObject *)&p->scale;
  }
  else if (MVar4 == Rotate) {
    p = (SceneObject *)&p->rotation;
  }
  else if (MVar4 == Translate) {
    p = (SceneObject *)&p->position;
  }
  if (MVar4 == Translate) {
    if (AVar3 == Center) {
      local_b8[0].x = (double)p->_vptr_SceneObject;
      local_b8[0].y = (double)p->scene;
      local_b8[0].z = (p->position).x;
      local_b8[0].w = 1.0;
      Matrix4x4::operator*(modelViewProj,local_b8);
      dVar14 = 1.0 / local_208.entries[0].w;
      local_b8[0].x = (local_208.entries[0].x * dVar14 + dx) * local_208.entries[0].w;
      local_b8[0].y = (local_208.entries[0].y * dVar14 + dy) * local_208.entries[0].w;
      local_b8[0].z = dVar14 * local_208.entries[0].z * local_208.entries[0].w;
      local_b8[0].w = local_208.entries[0].w * dVar14 * local_208.entries[0].w;
      Matrix4x4::inv(&local_208,modelViewProj);
      Matrix4x4::operator*(&local_208,local_b8);
      local_b8[0].z = local_118;
      local_b8[0].w = dStack_110;
      local_b8[0].x = local_128;
      Vector4D::to3D(local_b8);
      (p->position).x = local_208.entries[0].z;
      p->_vptr_SceneObject = (_func_int **)local_208.entries[0].x;
      p->scene = (Scene *)local_208.entries[0].y;
      return;
    }
  }
  else if (MVar4 == Rotate) {
    glGetDoublev(0xba6,&local_208);
    glGetDoublev(0xba7,local_b8);
    glGetIntegerv(0xba2,&local_128);
    gluProject(SUB84((this->center).x,0),SUB84((this->center).y,0),(this->center).z,&local_208,
               local_b8,&local_128,&local_f0,&local_f8,local_100);
    local_f8 = (double)iStack_11c - local_f8;
    dVar14 = atan2(local_f8 - y,x - local_f0);
    AVar3 = (this->target).axis;
    if (AVar3 != X) {
      if (AVar3 == Z) {
        p = (SceneObject *)&p->position;
      }
      else {
        if (AVar3 != Y) {
          return;
        }
        p = (SceneObject *)&p->scene;
      }
    }
    p->_vptr_SceneObject = (_func_int **)((dVar14 / 3.141592653589793) * 180.0);
    return;
  }
  local_b8[0].x = 0.0;
  local_b8[0].y = (double)((ulong)local_b8[0].y & 0xffffffff00000000);
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)local_b8;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_208,__l_00,(allocator_type *)&local_128);
  pp_Var9 = (_func_int **)local_208.entries[0].x;
  switch((this->target).axis) {
  case X:
    break;
  case Y:
    pp_Var9 = (_func_int **)((long)local_208.entries[0].x + 4);
    break;
  case Z:
    pp_Var9 = (_func_int **)((long)local_208.entries[0].x + 8);
    break;
  case Center:
    *(undefined8 *)((long)local_208.entries[0].x + 4) = 0x100000001;
    break;
  default:
    goto switchD_00175de4_default;
  }
  *(undefined4 *)pp_Var9 = 1;
switchD_00175de4_default:
  MVar4 = this->mode;
  dVar14 = (this->center).x;
  dVar1 = (this->center).y;
  dVar2 = (this->center).z;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_220,(vector<int,_std::allocator<int>_> *)&local_208);
  uVar10 = SUB84(dVar2,0);
  uVar11 = (undefined4)((ulong)dVar2 >> 0x20);
  uVar12 = SUB84(dVar1,0);
  uVar13 = (undefined4)((ulong)dVar1 >> 0x20);
  if (MVar4 != Translate) {
    uVar10 = 0;
    uVar11 = 0;
    uVar12 = 0;
    uVar13 = 0;
    dVar14 = 0.0;
  }
  local_d0.y = (double)CONCAT44(uVar13,uVar12);
  local_d0.z = (double)CONCAT44(uVar11,uVar10);
  local_d0.x = dVar14;
  directionalTransform(this,(Vector3D *)p,&local_220,&local_d0,x,y,dx,dy,modelViewProj);
  if (local_220.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_220.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_220.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_220.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
LAB_00176179:
  if ((_func_int **)local_208.entries[0].x != (_func_int **)0x0) {
    operator_delete((void *)local_208.entries[0].x,
                    (long)local_208.entries[0].z - (long)local_208.entries[0].x);
  }
  return;
}

Assistant:

void XFormWidget::drag( double x, double y, double dx, double dy, const Matrix4x4& modelViewProj )
{
  if (target.axis == Selection::Axis::None) return;
  if (target.object == nullptr) return;
  if (target.element == nullptr && !objectMode) return;

  if (objectMode) {
    Vector3D *update;
    switch (mode) {
      case Mode::Translate:
        update = &target.object->position;
        break;
      case Mode::Scale:
        update = &target.object->scale;
        break;
      case Mode::Rotate:
        update = &target.object->rotation;
        break;
    }

    if (mode == Mode::Rotate) {
      double winX, winY, winZ;
      double model[16], proj[16];
      int view[4];
      glGetDoublev(GL_MODELVIEW_MATRIX, model);
      glGetDoublev(GL_PROJECTION_MATRIX, proj);
      glGetIntegerv(GL_VIEWPORT, view);
      gluProject(center.x, center.y, center.z, model, proj, view, &winX, &winY, &winZ);
      winY = view[3] - winY;
      double theta = atan2(winY - y, x - winX) / PI * 180;
      switch (target.axis) {
        case Selection::Axis::X:
          update->x = theta;
          break;
        case Selection::Axis::Y:
          update->y = theta;
          break;
        case Selection::Axis::Z:
          update->z = theta;
          break;
        }
    }
    else if (mode == Mode::Translate &&
        target.axis == Selection::Axis::Center) {        
      Vector4D q( *update, 1. );
      q = modelViewProj * q; 
      double w = q.w;
      q /= w;
      // Shift by (dx, dy).
      q.x += dx;
      q.y += dy;
      // Transform back into model s*updateace
      q *= w;
      q = modelViewProj.inv() * q;
      *update = q.to3D();
    }
    else
    {
      vector<int> I = { 0, 0, 0 };
      switch (target.axis)
      {
      case Selection::Axis::X:
        I[0] = 1;
        break;
      case Selection::Axis::Y:
        I[1] = 1;
        break;
      case Selection::Axis::Z:
        I[2] = 1;
        break;
      case Selection::Axis::Center:
        I[0] = I[1] = I[2] = 1;
        break;
      default:
        break;
      }
      Vector3D c = mode == Mode::Translate ? center : Vector3D(0, 0, 0);
      directionalTransform(*update, I, c, x, y, dx, dy, modelViewProj);
    }

    return;
  }

   if( mode == Mode::Translate &&
       target.axis == Selection::Axis::Center )
   {
      target.element->translate( dx, dy, modelViewProj );
      // TODO uniform scale, free rotate
      return;
   }

   Vertex* v = target.element->getVertex();
   Edge*   e = target.element->getEdge();
   Face*   f = target.element->getFace();

   center = target.element->centroid();

   vector<int> I = { 0, 0, 0 };
   switch( target.axis )
   {
      case Selection::Axis::X:
         I[0] = 1;
         break;
      case Selection::Axis::Y:
         I[1] = 1;
         break;
      case Selection::Axis::Z:
         I[2] = 1;
         break;
      case Selection::Axis::Center:
         I[0] = I[1] = I[2] = 1;
         break;
      default:
         break;
   }

   if( v )
   {
      directionalTransform( v->position, I, center, x, y, dx, dy, modelViewProj );
   }
   else if( e )
   {
      HalfedgeIter h = e->halfedge();
      do
      {
         directionalTransform( h->vertex()->position, I, center, x, y, dx, dy, modelViewProj );
         h = h->twin();
      }
      while( h != e->halfedge() );
   }
   else if( f )
   {
      HalfedgeIter h = f->halfedge();
      do
      {
         directionalTransform( h->vertex()->position, I, center, x, y, dx, dy, modelViewProj );
         h = h->next();
      }
      while( h != f->halfedge() );
   }

   clickPosition = Vector2D(x,y);
}